

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O1

QSize __thiscall QLabelPrivate::sizeForWidth(QLabelPrivate *this,int w)

{
  short sVar1;
  short sVar2;
  QWidget *this_00;
  Data *pDVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  char cVar6;
  byte bVar7;
  undefined4 uVar8;
  uint uVar9;
  int iVar10;
  LayoutDirection direction;
  Alignment AVar11;
  Representation RVar12;
  int iVar13;
  QSize QVar14;
  undefined8 uVar15;
  QStyle *pQVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  QWidgetTextControl *this_01;
  uint uVar21;
  ulong uVar22;
  int iVar23;
  long in_FS_OFFSET;
  bool bVar24;
  double extraout_XMM0_Qa;
  qreal width;
  qreal width_00;
  double dVar25;
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar29 [16];
  QSizeF QVar30;
  QFontMetrics fm;
  QStyleOption opt;
  int local_c4;
  uint local_b8;
  QPixmap local_98 [24];
  undefined1 local_80 [8];
  undefined1 local_78 [12];
  undefined4 uStack_6c;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QPalettePrivate *pQStack_50;
  undefined1 *local_48;
  QObject *pQStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QFramePrivate).super_QWidgetPrivate.field_0x8;
  QVar14 = QWidget::minimumSize(this_00);
  if (0 < QVar14.wd.m_i.m_i) {
    QVar14 = QWidget::minimumSize(this_00);
    if (w < QVar14.wd.m_i.m_i) {
      w = QVar14.wd.m_i.m_i;
    }
  }
  iVar20 = (int)(this->super_QFramePrivate).super_QWidgetPrivate.rightmargin +
           (int)(this->super_QFramePrivate).super_QWidgetPrivate.leftmargin;
  sVar1 = (this->super_QFramePrivate).super_QWidgetPrivate.topmargin;
  sVar2 = (this->super_QFramePrivate).super_QWidgetPrivate.bottommargin;
  iVar23 = this->margin * 2;
  local_80 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  QFontMetrics::QFontMetrics((QFontMetrics *)local_80,&this_00->data->fnt);
  local_c4 = iVar23;
  if (((this->icon).super__Optional_base<QIcon,_false,_false>._M_payload.
       super__Optional_payload<QIcon,_true,_false,_false>.super__Optional_payload_base<QIcon>.
       _M_engaged == true) && (cVar6 = QIcon::isNull(), cVar6 == '\0')) {
    uVar19 = CONCAT44((this->pixmapSize).ht.m_i + -1,(this->pixmapSize).wd.m_i + -1);
LAB_0041781d:
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar19;
    auVar29 = auVar5 << 0x40;
  }
  else if (((this->picture).super__Optional_base<QPicture,_false,_false>._M_payload.
            super__Optional_payload<QPicture,_true,_false,_false>.
            super__Optional_payload_base<QPicture>._M_engaged == true) &&
          (cVar6 = QPicture::isNull(), cVar6 == '\0')) {
    if ((this->picture).super__Optional_base<QPicture,_false,_false>._M_payload.
        super__Optional_payload<QPicture,_true,_false,_false>.super__Optional_payload_base<QPicture>
        ._M_engaged == false) {
      sizeForWidth();
      goto LAB_00417c79;
    }
    auVar29 = QPicture::boundingRect();
  }
  else {
    pDVar3 = (this->movie).wp.d;
    if ((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) {
      bVar24 = false;
    }
    else {
      bVar24 = (this->movie).wp.value != (QObject *)0x0;
    }
    if (bVar24) {
      QMovie::currentPixmap();
      bVar7 = QPixmap::isNull();
      bVar7 = bVar7 ^ 1;
      QPixmap::~QPixmap(local_98);
    }
    else {
      bVar7 = 0;
    }
    if (bVar7 == 0) {
      if ((this->field_0x340 & 0x10) == 0) {
        iVar18 = QFontMetrics::averageCharWidth();
        iVar10 = QFontMetrics::lineSpacing();
        uVar19 = CONCAT44(iVar10 + -1,iVar18 + -1);
        goto LAB_0041781d;
      }
      direction = textDirection(this);
      AVar11 = QStyle::visualAlignment(direction,(Alignment)this->align);
      iVar18 = this->indent;
      if ((iVar18 < 0) && (iVar10 = QFrame::frameWidth((QFrame *)this_00), iVar10 != 0)) {
        iVar18 = QFontMetrics::horizontalAdvance((QChar)(char16_t)local_80);
        iVar18 = iVar18 + this->margin * -2;
      }
      iVar10 = iVar23;
      if (0 < iVar18) {
        iVar10 = iVar18 + iVar23;
        if (((uint)AVar11.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                   super_QFlagsStorage<Qt::AlignmentFlag>.i & 3) == 0) {
          iVar10 = iVar23;
        }
        if (((uint)AVar11.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                   super_QFlagsStorage<Qt::AlignmentFlag>.i & 0x60) != 0) {
          local_c4 = iVar18 + iVar23;
        }
      }
      iVar23 = iVar10;
      if (this->control == (QWidgetTextControl *)0x0) {
        uVar9 = (uint)AVar11.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                      super_QFlagsStorage<Qt::AlignmentFlag>.i & 0xffffff7b;
        if ((this->field_0x340 & 0x20) != 0) {
          local_48 = &DAT_aaaaaaaaaaaaaaaa;
          pQStack_40 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
          local_58 = &DAT_aaaaaaaaaaaaaaaa;
          pQStack_50 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
          local_68 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
          local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          stack0xffffffffffffff90 = &DAT_aaaaaaaaaaaaaaaa;
          local_b8 = (uint)AVar11.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                           super_QFlagsStorage<Qt::AlignmentFlag>.i & 0xffffff7b;
          QStyleOption::QStyleOption((QStyleOption *)local_78,1,0);
          QStyleOption::initFrom((QStyleOption *)local_78,this_00);
          pQVar16 = QWidget::style(this_00);
          iVar18 = (**(code **)(*(long *)pQVar16 + 0xf0))(pQVar16,0x29,local_78,this_00);
          uVar9 = (uint)(iVar18 == 0) << 0xf | local_b8 | 0x800;
          QStyleOption::~QStyleOption((QStyleOption *)local_78);
        }
        bVar7 = (byte)((uint)AVar11.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                             super_QFlagsStorage<Qt::AlignmentFlag>.i >> 0xc) & 1 & w < 0;
        if (bVar7 == 1) {
          iVar18 = QFontMetrics::averageCharWidth();
          QVar14 = QWidget::maximumSize(this_00);
          RVar12.m_i = QVar14.wd.m_i.m_i;
          if (iVar18 * 0x50 < QVar14.wd.m_i.m_i) {
            RVar12.m_i = iVar18 * 0x50;
          }
        }
        else {
          RVar12.m_i = 2000;
          if (-1 < w) {
            RVar12.m_i = w;
          }
        }
        iVar18 = (RVar12.m_i - iVar23) - iVar20;
        iVar10 = (int)this + 0x288;
        local_78._0_8_ = (undefined1 *)0x0;
        stack0xffffffffffffff90 = (undefined1 *)CONCAT44(1999,iVar18 + -1);
        auVar29 = QFontMetrics::boundingRect
                            ((QRect *)local_80,(int)local_78,(QString *)(ulong)uVar9,iVar10,
                             (int *)0x0);
        if (bVar7 != 0) {
          iVar17 = (auVar29._12_4_ - auVar29._4_4_) + 1;
          iVar13 = QFontMetrics::lineSpacing();
          if ((SBORROW4(iVar17,iVar13 * 4) != iVar17 + iVar13 * -4 < 0) &&
             (iVar18 / 2 < (auVar29._8_4_ - auVar29._0_4_) + 1)) {
            local_78._0_8_ = (undefined1 *)0x0;
            stack0xffffffffffffff90 = (undefined1 *)CONCAT44(1999,iVar18 / 2 + -1);
            auVar29 = QFontMetrics::boundingRect
                                ((QRect *)local_80,(int)local_78,(QString *)(ulong)uVar9,iVar10,
                                 (int *)0x0);
          }
          iVar17 = (auVar29._12_4_ - auVar29._4_4_) + 1;
          iVar13 = QFontMetrics::lineSpacing();
          if (SBORROW4(iVar17,iVar13 * 2) != iVar17 + iVar13 * -2 < 0) {
            iVar13 = iVar18 + 3;
            if (-1 < iVar18) {
              iVar13 = iVar18;
            }
            if (iVar13 >> 2 < (auVar29._8_4_ - auVar29._0_4_) + 1) {
              local_78._0_8_ = (undefined1 *)0x0;
              stack0xffffffffffffff90 = (undefined1 *)CONCAT44(1999,(iVar13 >> 2) + -1);
              auVar29 = QFontMetrics::boundingRect
                                  ((QRect *)local_80,(int)local_78,(QString *)(ulong)uVar9,iVar10,
                                   (int *)0x0);
            }
          }
        }
        goto LAB_00417845;
      }
      ensureTextLayouted(this);
      width = QWidgetTextControl::textWidth((QWidgetTextControl *)this->control);
      if (((uint)AVar11.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                 super_QFlagsStorage<Qt::AlignmentFlag>.i >> 0xc & 1) == 0) {
        this_01 = (QWidgetTextControl *)this->control;
        width_00 = -1.0;
LAB_00417ab2:
        QWidgetTextControl::setTextWidth(this_01,width_00);
      }
      else {
        if (-1 < w) {
          iVar10 = (w - iVar20) - iVar23;
          iVar18 = 0;
          if (0 < iVar10) {
            iVar18 = iVar10;
          }
          this_01 = (QWidgetTextControl *)this->control;
          width_00 = (qreal)iVar18;
          goto LAB_00417ab2;
        }
        QWidgetTextControl::adjustSize((QWidgetTextControl *)this->control);
      }
      QVar30 = QWidgetTextControl::size((QWidgetTextControl *)this->control);
      dVar25 = ceil(QVar30.wd);
      dVar26 = ceil(QVar30.ht);
      auVar4._4_4_ = (int)dVar26 + -1;
      auVar4._0_4_ = (int)dVar25 + -1;
      QWidgetTextControl::setTextWidth((QWidgetTextControl *)this->control,width);
      auVar4._8_8_ = 0;
      auVar29 = auVar4 << 0x40;
    }
    else {
      QMovie::currentPixmap();
      uVar15 = QPixmap::rect();
      QPixmap::~QPixmap((QPixmap *)local_78);
      QMovie::currentPixmap();
      uVar8 = QPixmap::deviceIndependentSize();
      auVar27._0_8_ =
           (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
           extraout_XMM1_Qa;
      auVar27._8_8_ =
           (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
           extraout_XMM0_Qa;
      auVar29 = minpd(_DAT_0066f5d0,auVar27);
      auVar28._8_8_ = -(ulong)(-2147483648.0 < auVar29._8_8_);
      auVar28._0_8_ = -(ulong)(-2147483648.0 < auVar29._0_8_);
      uVar9 = movmskpd(uVar8,auVar28);
      iVar18 = (int)auVar29._8_8_;
      if ((uVar9 & 2) == 0) {
        iVar18 = -0x80000000;
      }
      iVar10 = (int)auVar29._0_8_;
      if ((uVar9 & 1) == 0) {
        iVar10 = -0x80000000;
      }
      auVar29._12_4_ = (int)((ulong)uVar15 >> 0x20) + iVar10 + -1;
      auVar29._8_4_ = (int)uVar15 + iVar18 + -1;
      auVar29._0_8_ = uVar15;
      QPixmap::~QPixmap((QPixmap *)local_78);
    }
  }
LAB_00417845:
  uVar21 = iVar23 + (iVar20 - auVar29._0_4_) + auVar29._8_4_ + 1;
  uVar9 = auVar29._12_4_ + (((int)sVar1 + (int)sVar2) - auVar29._4_4_) + local_c4 + 1;
  QVar14 = QWidget::minimumSize(this_00);
  uVar19 = (ulong)QVar14 >> 0x20;
  uVar22 = (ulong)uVar21;
  if ((int)uVar21 <= QVar14.wd.m_i.m_i) {
    uVar22 = (ulong)QVar14 & 0xffffffff;
  }
  if (QVar14.ht.m_i.m_i < (int)uVar9) {
    uVar19 = (ulong)uVar9;
  }
  QFontMetrics::~QFontMetrics((QFontMetrics *)local_80);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QSize)(uVar22 | uVar19 << 0x20);
  }
LAB_00417c79:
  __stack_chk_fail();
}

Assistant:

QSize QLabelPrivate::sizeForWidth(int w) const
{
    Q_Q(const QLabel);
    if (q->minimumWidth() > 0)
        w = qMax(w, q->minimumWidth());
    QSize contentsMargin(leftmargin + rightmargin, topmargin + bottommargin);

    QRect br;

    int hextra = 2 * margin;
    int vextra = hextra;
    QFontMetrics fm = q->fontMetrics();

    if (icon && !icon->isNull()) {
        br = QRect(QPoint(0, 0), pixmapSize);
#ifndef QT_NO_PICTURE
    } else if (picture && !picture->isNull()) {
        br = picture->boundingRect();
#endif
#if QT_CONFIG(movie)
    } else if (movie && !movie->currentPixmap().isNull()) {
        br = movie->currentPixmap().rect();
        br.setSize(movie->currentPixmap().deviceIndependentSize().toSize());
#endif
    } else if (isTextLabel) {
        int align = QStyle::visualAlignment(textDirection(), QFlag(this->align));
        // Add indentation
        int m = indent;

        if (m < 0 && q->frameWidth()) // no indent, but we do have a frame
            m = fm.horizontalAdvance(u'x') - margin*2;
        if (m > 0) {
            if ((align & Qt::AlignLeft) || (align & Qt::AlignRight))
                hextra += m;
            if ((align & Qt::AlignTop) || (align & Qt::AlignBottom))
                vextra += m;
        }

        if (control) {
            ensureTextLayouted();
            const qreal oldTextWidth = control->textWidth();
            // Calculate the length of document if w is the width
            if (align & Qt::TextWordWrap) {
                if (w >= 0) {
                    w = qMax(w-hextra-contentsMargin.width(), 0); // strip margin and indent
                    control->setTextWidth(w);
                } else {
                    control->adjustSize();
                }
            } else {
                control->setTextWidth(-1);
            }

            QSizeF controlSize = control->size();
            br = QRect(QPoint(0, 0), QSize(qCeil(controlSize.width()), qCeil(controlSize.height())));

            // restore state
            control->setTextWidth(oldTextWidth);
        } else {
            // Turn off center alignment in order to avoid rounding errors for centering,
            // since centering involves a division by 2. At the end, all we want is the size.
            int flags = align & ~(Qt::AlignVCenter | Qt::AlignHCenter);
            if (hasShortcut) {
                flags |= Qt::TextShowMnemonic;
                QStyleOption opt;
                opt.initFrom(q);
                if (!q->style()->styleHint(QStyle::SH_UnderlineShortcut, &opt, q))
                    flags |= Qt::TextHideMnemonic;
            }

            bool tryWidth = (w < 0) && (align & Qt::TextWordWrap);
            if (tryWidth)
                w = qMin(fm.averageCharWidth() * 80, q->maximumSize().width());
            else if (w < 0)
                w = 2000;
            w -= (hextra + contentsMargin.width());
            br = fm.boundingRect(0, 0, w ,2000, flags, text);
            if (tryWidth && br.height() < 4*fm.lineSpacing() && br.width() > w/2)
                br = fm.boundingRect(0, 0, w/2, 2000, flags, text);
            if (tryWidth && br.height() < 2*fm.lineSpacing() && br.width() > w/4)
                br = fm.boundingRect(0, 0, w/4, 2000, flags, text);
        }
    } else {
        br = QRect(QPoint(0, 0), QSize(fm.averageCharWidth(), fm.lineSpacing()));
    }

    const QSize contentsSize(br.width() + hextra, br.height() + vextra);
    return (contentsSize + contentsMargin).expandedTo(q->minimumSize());
}